

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::DeadStoreInstr(BackwardPass *this,Instr *instr)

{
  ArgSlot *pAVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  JitArenaAllocator *pJVar3;
  StackSym *pSVar4;
  Type pBVar5;
  undefined1 auVar6 [8];
  Opnd *this_00;
  long lVar7;
  code *pcVar8;
  bool bVar9;
  OpndKind OVar10;
  ArgSlot AVar11;
  RegSlot RVar12;
  undefined4 *puVar13;
  StackSym *pSVar14;
  Func *pFVar15;
  BVSparseNode *pBVar16;
  Type_conflict pBVar17;
  JITTimeFunctionBody *this_01;
  BVSparseNode<Memory::JitArenaAllocator> *pBVar18;
  BVSparseNode *pBVar19;
  Type_conflict pBVar20;
  BasicBlock *this_02;
  ulong uVar21;
  ulong uVar22;
  PropertySym *local_a0;
  PropertySym *unusedPropertySym;
  Instr *local_90;
  BasicBlock *local_88;
  BVSparseNode<Memory::JitArenaAllocator> *local_80;
  undefined1 auStack_78 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv;
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  
  this_02 = this->currentBlock;
  bVar9 = IsTraceEnabled(this);
  if (bVar9) {
    Output::Print(L"Deadstore instr: ");
    IR::Instr::Dump(instr);
  }
  this->numDeadStore = this->numDeadStore + 1;
  bVar9 = DoByteCodeUpwardExposedUsed(this);
  if (bVar9) {
    tempBv.lastFoundIndex = (Type_conflict)this->tempAlloc;
    tempBv.alloc = (Type)auStack_78;
    auStack_78 = (undefined1  [8])0x0;
    tempBv.head = (Type_conflict)0x0;
    pBVar2 = this->currentBlock->byteCodeUpwardExposedUsed;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar2);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,pBVar2->head);
    local_a0 = (PropertySym *)0x0;
    GlobOpt::TrackByteCodeSymUsed(instr,this->currentBlock->byteCodeUpwardExposedUsed,&local_a0);
    pJVar3 = this->tempAlloc;
    tempBv.lastUsedNodePrevNextField = (Type)0x0;
    pBVar2 = this->currentBlock->byteCodeUpwardExposedUsed;
    local_90 = instr;
    local_88 = this_02;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar2);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv.lastUsedNodePrevNextField,pBVar2->head
              );
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv.lastUsedNodePrevNextField,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
    pBVar18 = (BVSparseNode<Memory::JitArenaAllocator> *)tempBv.lastUsedNodePrevNextField;
    if (tempBv.lastUsedNodePrevNextField != (Type)0x0) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        uVar22 = (pBVar18->data).word;
        local_80 = pBVar18;
        if (uVar22 != 0) {
          unusedPropertySym = (PropertySym *)(ulong)pBVar18->startIndex;
          uVar21 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar21);
            pSVar14 = SymTable::FindStackSym
                                (this->func->m_symTable,(BVIndex)uVar21 + (int)unusedPropertySym);
            if (pSVar14->m_type != TyVar) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1f55,"(stackSym->GetType() == TyVar)",
                                 "stackSym->GetType() == TyVar");
              if (!bVar9) goto LAB_003eec09;
              *puVar13 = 0;
            }
            pFVar15 = StackSym::GetByteCodeFunc(pSVar14);
            if (pFVar15 == this->func) {
              RVar12 = StackSym::GetByteCodeRegSlot(pSVar14);
              if (RVar12 == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x1f5a,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                   "byteCodeRegSlot != Js::Constants::NoRegister");
                if (!bVar9) goto LAB_003eec09;
                *puVar13 = 0;
              }
              pSVar4 = this->currentBlock->byteCodeRestoreSyms[RVar12];
              if (pSVar4 != pSVar14) {
                if (pSVar4 != (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                     ,0x1f5e,
                                     "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                     ,
                                     "Can\'t have two active lifetime for the same byte code register"
                                    );
                  if (!bVar9) goto LAB_003eec09;
                  *puVar13 = 0;
                }
                this->currentBlock->byteCodeRestoreSyms[RVar12] = pSVar14;
              }
            }
            uVar22 = uVar22 & ~(1L << (uVar21 & 0x3f));
            lVar7 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar21 = (ulong)(-(uint)(uVar22 == 0) | (uint)lVar7);
          } while (uVar22 != 0);
        }
        pBVar18 = local_80->next;
      } while (pBVar18 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    }
    if (tempBv.lastUsedNodePrevNextField != (Type)0x0) {
      pBVar5 = (Type)tempBv.lastUsedNodePrevNextField;
      pBVar19 = pJVar3->bvFreeList;
      do {
        pBVar16 = pBVar5;
        pBVar5 = pBVar16->next;
        pBVar16->next = pBVar19;
        pBVar19 = pBVar16;
      } while (pBVar5 != (Type)0x0);
      pJVar3->bvFreeList = pBVar16;
    }
    this_02 = local_88;
    instr = local_90;
    if (auStack_78 != (undefined1  [8])0x0) {
      auVar6 = auStack_78;
      pBVar20 = *(Type_conflict *)&tempBv.lastFoundIndex[5].startIndex;
      do {
        pBVar17 = (Type_conflict)auVar6;
        auVar6 = (undefined1  [8])pBVar17->next;
        pBVar17->next = pBVar20;
        pBVar20 = pBVar17;
      } while (auVar6 != (undefined1  [8])0x0);
      tempBv.head = (Type_conflict)0x0;
      *(Type_conflict *)&tempBv.lastFoundIndex[5].startIndex = pBVar17;
      tempBv.alloc = (Type)auStack_78;
    }
  }
  if (this->preOpBailOutInstrToProcess != instr && this->preOpBailOutInstrToProcess != (Instr *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1f69,
                       "(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr)",
                       "!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr");
    if (!bVar9) goto LAB_003eec09;
    *puVar13 = 0;
  }
  this->preOpBailOutInstrToProcess = (Instr *)0x0;
  if ((this->tag == DeadStorePhase) && (bVar9 = SatisfyMarkTempObjectsConditions(this), bVar9)) {
    ObjectTempVerify::NotifyDeadStore
              (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
  }
  if (instr->m_opcode == ArgIn_A) {
    this_00 = instr->m_src1;
    OVar10 = IR::Opnd::GetKind(this_00);
    if (OVar10 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar9) goto LAB_003eec09;
      *puVar13 = 0;
    }
    pSVar14 = (StackSym *)this_00[1]._vptr_Opnd;
    if ((pSVar14->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar9) goto LAB_003eec09;
      *puVar13 = 0;
    }
    AVar11 = StackSym::GetParamSlotNum(pSVar14);
    if (AVar11 == 1) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      bVar9 = JITTimeFunctionBody::IsAsmJsMode(this_01);
      if (!bVar9) goto LAB_003eebe5;
    }
    if (this->func->argInsCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1f7a,"(this->func->argInsCount > 0)","this->func->argInsCount > 0");
      if (!bVar9) {
LAB_003eec09:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar13 = 0;
    }
    pAVar1 = &this->func->argInsCount;
    *pAVar1 = *pAVar1 - 1;
  }
LAB_003eebe5:
  TraceDeadStoreOfInstrsForScopeObjectRemoval(this);
  BasicBlock::RemoveInstr(this_02,instr);
  return true;
}

Assistant:

bool
BackwardPass::DeadStoreInstr(IR::Instr *instr)
{
    BasicBlock * block = this->currentBlock;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("Deadstore instr: "));
        instr->Dump();
    }
    this->numDeadStore++;
#endif

    // Before we remove the dead store, we need to track the byte code uses
    if (this->DoByteCodeUpwardExposedUsed())
    {
#if DBG
        BVSparse<JitArenaAllocator> tempBv(this->tempAlloc);
        tempBv.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
#endif
        PropertySym *unusedPropertySym = nullptr;

        GlobOpt::TrackByteCodeSymUsed(instr, this->currentBlock->byteCodeUpwardExposedUsed, &unusedPropertySym);

#if DBG
        BVSparse<JitArenaAllocator> tempBv2(this->tempAlloc);
        tempBv2.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
        tempBv2.Minus(&tempBv);
        FOREACH_BITSET_IN_SPARSEBV(symId, &tempBv2)
        {
            StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
            Assert(stackSym->GetType() == TyVar);
            // TODO: We can only track first level function stack syms right now
            if (stackSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                {
                    AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
#endif
    }

    // If this is a pre-op bailout instruction, we may have saved it for bailout info processing. It's being removed now, so no
    // need to process the bailout info anymore.
    Assert(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr);
    preOpBailOutInstrToProcess = nullptr;

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyDeadStore(instr, this);
    }
#endif


    if (instr->m_opcode == Js::OpCode::ArgIn_A)
    {
        // Ignore tracking ArgIn for "this" as argInsCount only tracks other
        // params, unless it is a AsmJS function (which doesn't have a "this").
        if (instr->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() != 1 || func->GetJITFunctionBody()->IsAsmJsMode())
        {
            Assert(this->func->argInsCount > 0);
            this->func->argInsCount--;
        }
    }

    TraceDeadStoreOfInstrsForScopeObjectRemoval();

    block->RemoveInstr(instr);
    return true;
}